

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_secondary_kvs(void)

{
  uint __line;
  fdb_status fVar1;
  char *__format;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *kv2;
  size_t valuelen_out;
  void *value_out;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&kv1,&kvs_config);
  fdb_kvs_open_default(dbfile,&kv2,&kvs_config);
  fVar1 = fdb_set_kv(kv1,"a",1,"val-a",5);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_set_kv(kv1,"b",1,"val-b",5);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_commit(dbfile,'\x01');
      fVar1 = fdb_set_kv(kv1,"b",1,"val-v",5);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_commit(dbfile,'\x01');
        fVar1 = fdb_del_kv(kv1,"a",1);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          fdb_commit(dbfile,'\x01');
          fVar1 = fdb_get_kv(kv2,"b",1,&value_out,&valuelen_out);
          free(value_out);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            fVar1 = fdb_rollback(&kv2,3);
            if (fVar1 == FDB_RESULT_SUCCESS) {
              fdb_close(dbfile);
              fdb_shutdown();
              memleak_end();
              __format = "%s PASSED\n";
              if (rollback_secondary_kvs()::__test_pass != '\0') {
                __format = "%s FAILED\n";
              }
              fprintf(_stderr,__format,"rollback secondary kv");
              return;
            }
            __line = 0x50;
          }
          else {
            __line = 0x4c;
          }
        }
        else {
          __line = 0x46;
        }
      }
      else {
        __line = 0x41;
      }
    }
    else {
      __line = 0x3c;
    }
  }
  else {
    __line = 0x3a;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,__line);
  rollback_secondary_kvs()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,__line,"void rollback_secondary_kvs()");
}

Assistant:

void rollback_secondary_kvs()
{
    TEST_INIT();
    memleak_start();

    int r;
    void *value_out;
    size_t valuelen_out;

    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    fdb_kvs_open_default(dbfile, &kv2, &kvs_config);

    // seq:2
    status = fdb_set_kv(kv1, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:3
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-v", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:4
    status = fdb_del_kv(kv1, (void *)"a", 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // get 'a' via kv2
    status = fdb_get_kv(kv2, (void *)"b", 1, &value_out, &valuelen_out);
    free(value_out);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback seq:3 via kv2
    status = fdb_rollback(&kv2, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback secondary kv");
}